

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore_adf.cc
# Opt level: O0

void CB_EXPLORE_ADF::predict_or_learn_softmax<false>
               (cb_explore_adf *data,multi_learner *base,multi_ex *examples)

{
  reference ppeVar1;
  score_iterator *in_RDX;
  score_iterator *in_RSI;
  score_iterator *in_RDI;
  undefined4 unaff_retaddr;
  float unaff_retaddr_00;
  v_array<ACTION_SCORE::action_score> *preds;
  action_scores *in_stack_ffffffffffffff88;
  score_iterator *in_stack_ffffffffffffffb0;
  score_iterator *in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffc3;
  float in_stack_ffffffffffffffc4;
  score_iterator *pdf_last;
  
  LEARNER::multiline_learn_or_predict<false>
            ((multi_learner *)CONCAT44(unaff_retaddr_00,unaff_retaddr),(multi_ex *)in_RDI,
             (uint64_t)in_RSI,(uint32_t)((ulong)in_RDX >> 0x20));
  ppeVar1 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                      ((vector<example_*,_std::allocator<example_*>_> *)in_RDX,0);
  pdf_last = (score_iterator *)&(*ppeVar1)->pred;
  ACTION_SCORE::begin_scores(in_stack_ffffffffffffff88);
  ACTION_SCORE::end_scores(in_stack_ffffffffffffff88);
  ACTION_SCORE::begin_scores(in_stack_ffffffffffffff88);
  ACTION_SCORE::end_scores(in_stack_ffffffffffffff88);
  exploration::generate_softmax<ACTION_SCORE::score_iterator,ACTION_SCORE::score_iterator>
            (unaff_retaddr_00,in_RDI,in_RSI,in_RDX,pdf_last);
  ACTION_SCORE::begin_scores(in_stack_ffffffffffffff88);
  ACTION_SCORE::end_scores(in_stack_ffffffffffffff88);
  exploration::enforce_minimum_probability<ACTION_SCORE::score_iterator>
            (in_stack_ffffffffffffffc4,(bool)in_stack_ffffffffffffffc3,in_stack_ffffffffffffffb8,
             in_stack_ffffffffffffffb0);
  return;
}

Assistant:

void predict_or_learn_softmax(cb_explore_adf& data, multi_learner& base, multi_ex& examples)
{
  if (is_learn && test_adf_sequence(examples) != nullptr)
    multiline_learn_or_predict<true>(base, examples, data.offset);
  else
    multiline_learn_or_predict<false>(base, examples, data.offset);

  v_array<action_score>& preds = examples[0]->pred.a_s;
  generate_softmax(data.lambda, begin_scores(preds), end_scores(preds), begin_scores(preds), end_scores(preds));

  enforce_minimum_probability(data.epsilon, true, begin_scores(preds), end_scores(preds));
}